

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBuilderBeam.cpp
# Opt level: O3

void __thiscall chrono::fea::ChExtruderBeamEuler::~ChExtruderBeamEuler(ChExtruderBeamEuler *this)

{
  ChSystem *pCVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  shared_ptr<chrono::ChPhysicsItem> local_28;
  shared_ptr<chrono::ChPhysicsItem> local_18;
  
  local_18.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (this->actuator).
       super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_18.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->actuator).
       super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  pCVar1 = this->mysystem;
  p_Var2 = (this->actuator).
           super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  ChSystem::Remove(pCVar1,&local_18);
  if (local_18.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_18.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_28.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &((this->ground).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_ChPhysicsItem;
  local_28.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ground).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  pCVar1 = this->mysystem;
  p_Var2 = (this->ground).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  ChSystem::Remove(pCVar1,&local_28);
  if (local_28.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  p_Var2 = (this->contactcloud).
           super___shared_ptr<chrono::fea::ChContactSurfaceNodeCloud,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (this->contact_material).
           super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (this->beam_section).
           super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (this->mesh).super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (this->guide).super___shared_ptr<chrono::ChLinkMateGeneric,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (this->actuator).
           super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (this->ground).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::~vector(&this->beam_nodes);
  std::
  vector<std::shared_ptr<chrono::fea::ChElementBeamEuler>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamEuler>_>_>
  ::~vector(&this->beam_elems);
  return;
}

Assistant:

ChExtruderBeamEuler::~ChExtruderBeamEuler() {
    mysystem->Remove(actuator);
    mysystem->Remove(ground);
}